

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t generic_unpack_deep_pointers(exr_decode_pipeline_t *decode)

{
  char cVar1;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  exr_coding_channel_info_t *peVar5;
  uint uVar6;
  char cVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  float fVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  void *pvVar17;
  ushort uVar18;
  int32_t *piVar19;
  bool bVar20;
  uint uVar21;
  float fVar22;
  uint uVar23;
  int iVar24;
  uint8_t *puVar25;
  long lVar26;
  uint8_t *cdata;
  float *pfVar27;
  ulong uVar28;
  
  iVar3 = (decode->chunk).height;
  uVar9 = iVar3 - decode->user_line_end_ignore;
  if (uVar9 == 0 || iVar3 < decode->user_line_end_ignore) {
    return 0;
  }
  uVar4 = (decode->chunk).width;
  iVar3 = decode->user_line_begin_skip;
  pvVar17 = decode->unpacked_buffer;
  piVar19 = decode->sample_count_table;
  uVar28 = 0;
  do {
    bVar20 = 0 < decode->channel_count;
    if (0 < decode->channel_count) {
      peVar5 = decode->channels;
      lVar26 = 0;
      do {
        cVar1 = peVar5[lVar26].bytes_per_element;
        if (((long)uVar28 < (long)iVar3) ||
           (peVar5[lVar26].field_12.decode_to_ptr == (uint8_t *)0x0)) {
          if ((decode->decode_flags & 1) == 0) {
            iVar10 = piVar19[(long)(int)uVar4 + -1];
          }
          else if ((int)uVar4 < 1) {
            iVar10 = 0;
          }
          else {
            uVar16 = 0;
            iVar10 = 0;
            do {
              iVar10 = iVar10 + piVar19[uVar16];
              uVar16 = uVar16 + 1;
            } while (uVar4 != uVar16);
          }
          pvVar17 = (void *)((long)pvVar17 + (long)iVar10 * (long)cVar1);
          iVar10 = 7;
        }
        else if ((int)uVar4 < 1) {
          iVar10 = 0;
        }
        else {
          lVar11 = (long)peVar5[lVar26].user_bytes_per_element;
          iVar10 = peVar5[lVar26].user_pixel_stride;
          puVar25 = peVar5[lVar26].field_12.decode_to_ptr +
                    ((ulong)(long)peVar5[lVar26].user_line_stride >> 3) * (uVar28 - (long)iVar3) * 8
          ;
          uVar16 = 0;
          iVar24 = 0;
          do {
            pfVar27 = *(float **)puVar25;
            iVar15 = iVar24;
            iVar12 = piVar19[uVar16];
            if ((decode->decode_flags & 1) != 0) {
              iVar15 = 0;
              iVar12 = iVar24;
            }
            iVar24 = iVar12;
            iVar15 = piVar19[uVar16] - iVar15;
            if (pfVar27 == (float *)0x0) {
LAB_00131381:
              pvVar17 = (void *)((long)pvVar17 + (long)iVar15 * (long)cVar1);
              bVar8 = true;
            }
            else {
              uVar2 = peVar5[lVar26].data_type;
              if (uVar2 == 0) {
                uVar2 = peVar5[lVar26].user_data_type;
                if (uVar2 == 2) {
                  if (0 < iVar15) {
                    lVar14 = 0;
                    do {
                      *pfVar27 = (float)*(uint *)((long)pvVar17 + lVar14 * 4);
                      pfVar27 = (float *)((long)pfVar27 + lVar11);
                      lVar14 = lVar14 + 1;
                    } while (iVar15 != (int)lVar14);
                  }
                }
                else if (uVar2 == 1) {
                  if (0 < iVar15) {
                    lVar14 = 0;
                    do {
                      uVar23 = *(uint *)((long)pvVar17 + lVar14 * 4);
                      uVar18 = 0x7c00;
                      if (uVar23 < 0xffe1) {
                        fVar22 = (float)(int)uVar23;
                        if ((uint)fVar22 < 0x38800000) {
                          if ((uint)fVar22 < 0x33000001) {
                            uVar18 = 0;
                          }
                          else {
                            uVar23 = (uint)fVar22 & 0x7fffff | 0x800000;
                            cVar7 = (char)((uint)fVar22 >> 0x17);
                            uVar18 = (ushort)(uVar23 >> (0x7eU - cVar7 & 0x1f));
                            if (0x80000000 < uVar23 << (cVar7 + 0xa2U & 0x1f)) {
                              uVar18 = uVar18 + 1;
                            }
                          }
                        }
                        else if ((uint)fVar22 < 0x7f800000) {
                          if ((uint)fVar22 < 0x477ff000) {
                            uVar18 = (ushort)((int)fVar22 + 0x8000fff +
                                              (uint)(((uint)fVar22 >> 0xd & 1) != 0) >> 0xd);
                          }
                        }
                        else if (fVar22 != INFINITY) {
                          uVar23 = (uint)fVar22 >> 0xd & 0x3ff;
                          uVar18 = (ushort)(uVar23 == 0) | (ushort)uVar23 | 0x7c00;
                        }
                      }
                      *(ushort *)pfVar27 = uVar18;
                      pfVar27 = (float *)((long)pfVar27 + lVar11);
                      lVar14 = lVar14 + 1;
                    } while (iVar15 != (int)lVar14);
                  }
                }
                else {
                  if (uVar2 != 0) goto LAB_0013109a;
                  if (0 < iVar15) {
                    lVar14 = 0;
                    do {
                      *pfVar27 = *(float *)((long)pvVar17 + lVar14 * 4);
                      pfVar27 = (float *)((long)pfVar27 + lVar11);
                      lVar14 = lVar14 + 1;
                    } while (iVar15 != (int)lVar14);
                  }
                }
                goto LAB_00131381;
              }
              if (uVar2 == 2) {
                uVar2 = peVar5[lVar26].user_data_type;
                if (uVar2 == 2) {
                  if (0 < iVar15) {
                    lVar14 = 0;
                    do {
                      *pfVar27 = *(float *)((long)pvVar17 + lVar14 * 4);
                      pfVar27 = (float *)((long)pfVar27 + lVar11);
                      lVar14 = lVar14 + 1;
                    } while (iVar15 != (int)lVar14);
                  }
                }
                else if (uVar2 == 1) {
                  if (0 < iVar15) {
                    lVar14 = 0;
                    do {
                      uVar23 = *(uint *)((long)pvVar17 + lVar14 * 4);
                      uVar21 = uVar23 & 0x7fffffff;
                      uVar18 = (ushort)(uVar23 >> 0x10) & 0x8000;
                      if (uVar21 < 0x38800000) {
                        if ((0x33000000 < uVar21) &&
                           (uVar23 = uVar23 & 0x7fffff | 0x800000, cVar7 = (char)(uVar21 >> 0x17),
                           uVar18 = uVar18 | (ushort)(uVar23 >> (0x7eU - cVar7 & 0x1f)),
                           0x80000000 < uVar23 << (cVar7 + 0xa2U & 0x1f))) {
                          uVar18 = uVar18 + 1;
                        }
                      }
                      else if (uVar21 < 0x7f800000) {
                        if (uVar21 < 0x477ff000) {
                          uVar18 = (ushort)(uVar21 + 0x8000fff + (uint)((uVar21 >> 0xd & 1) != 0) >>
                                           0xd) | uVar18;
                        }
                        else {
                          uVar18 = uVar18 | 0x7c00;
                        }
                      }
                      else {
                        uVar18 = uVar18 | 0x7c00;
                        if (uVar21 != 0x7f800000) {
                          uVar23 = uVar21 >> 0xd & 0x3ff;
                          uVar18 = uVar18 | (ushort)uVar23 | (ushort)(uVar23 == 0);
                        }
                      }
                      *(ushort *)pfVar27 = uVar18;
                      pfVar27 = (float *)((long)pfVar27 + lVar11);
                      lVar14 = lVar14 + 1;
                    } while (iVar15 != (int)lVar14);
                  }
                }
                else {
                  if (uVar2 != 0) goto LAB_0013109a;
                  if (0 < iVar15) {
                    lVar14 = 0;
                    do {
                      fVar22 = *(float *)((long)pvVar17 + lVar14 * 4);
                      fVar13 = 0.0;
                      if (0.0 <= fVar22) {
                        fVar13 = (float)(long)fVar22;
                        if (ABS(fVar22) == INFINITY) {
                          fVar13 = -NAN;
                        }
                        if (4.2949673e+09 < fVar22) {
                          fVar13 = -NAN;
                        }
                      }
                      *pfVar27 = fVar13;
                      pfVar27 = (float *)((long)pfVar27 + lVar11);
                      lVar14 = lVar14 + 1;
                    } while (iVar15 != (int)lVar14);
                  }
                }
                goto LAB_00131381;
              }
              if (uVar2 == 1) {
                uVar2 = peVar5[lVar26].user_data_type;
                if (uVar2 == 2) {
                  if (0 < iVar15) {
                    lVar14 = 0;
                    do {
                      uVar23 = (uint)*(short *)((long)pvVar17 + lVar14 * 2);
                      uVar21 = (uVar23 & 0x7fff) << 0xd;
                      fVar22 = (float)(uVar23 & 0x80000000);
                      if (uVar21 < 0x800000) {
                        if ((uVar23 & 0x7fff) != 0) {
                          uVar6 = 0x1f;
                          if ((uVar23 & 0x7fff) != 0) {
                            for (; uVar21 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                            }
                          }
                          iVar12 = (uVar6 ^ 0x1f) - 8;
                          fVar22 = (float)(((uint)fVar22 | uVar21 << ((byte)iVar12 & 0x1f) |
                                           0x38800000) + iVar12 * -0x800000);
                        }
                      }
                      else if (uVar21 < 0xf800000) {
                        fVar22 = (float)(((uint)fVar22 | uVar21) + 0x38000000);
                      }
                      else {
                        fVar22 = (float)((uint)fVar22 | uVar21 | 0x7f800000);
                      }
                      *pfVar27 = fVar22;
                      pfVar27 = (float *)((long)pfVar27 + lVar11);
                      lVar14 = lVar14 + 1;
                    } while (iVar15 != (int)lVar14);
                  }
                }
                else if (uVar2 == 1) {
                  if (0 < iVar15) {
                    lVar14 = 0;
                    do {
                      *(ushort *)pfVar27 = *(ushort *)((long)pvVar17 + lVar14 * 2);
                      pfVar27 = (float *)((long)pfVar27 + lVar11);
                      lVar14 = lVar14 + 1;
                    } while (iVar15 != (int)lVar14);
                  }
                }
                else {
                  if (uVar2 != 0) goto LAB_0013109a;
                  if (0 < iVar15) {
                    lVar14 = 0;
                    do {
                      uVar18 = *(ushort *)((long)pvVar17 + lVar14 * 2);
                      uVar23 = (uint)uVar18;
                      if ((short)uVar18 < 0) {
                        fVar22 = 0.0;
                      }
                      else if ((~uVar23 & 0x7c00) == 0) {
                        fVar22 = (float)-(uint)((uVar18 & 0x3ff) == 0);
                      }
                      else {
                        uVar21 = uVar23 * 0x2000;
                        if (uVar23 < 0x400) {
                          if (uVar18 == 0) {
                            fVar22 = 0.0;
                          }
                          else {
                            uVar6 = 0x1f;
                            if (uVar23 != 0) {
                              for (; uVar21 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                              }
                            }
                            iVar12 = (uVar6 ^ 0x1f) - 8;
                            fVar22 = (float)((uVar21 << ((byte)iVar12 & 0x1f) | 0x38800000) +
                                            iVar12 * -0x800000);
                          }
                        }
                        else if (uVar23 < 0x7c00) {
                          fVar22 = (float)(uVar21 + 0x38000000);
                        }
                        else {
                          fVar22 = (float)(uVar21 | 0x7f800000);
                        }
                        fVar22 = (float)(long)fVar22;
                      }
                      *pfVar27 = fVar22;
                      pfVar27 = (float *)((long)pfVar27 + lVar11);
                      lVar14 = lVar14 + 1;
                    } while (iVar15 != (int)lVar14);
                  }
                }
                goto LAB_00131381;
              }
LAB_0013109a:
              bVar8 = false;
            }
            if (!bVar8) {
              iVar10 = 1;
              goto LAB_0013141e;
            }
            puVar25 = puVar25 + ((long)iVar10 & 0xfffffffffffffff8);
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar4);
          iVar10 = 0;
        }
LAB_0013141e:
        if ((iVar10 != 7) && (iVar10 != 0)) break;
        lVar26 = lVar26 + 1;
        bVar20 = lVar26 < decode->channel_count;
      } while (lVar26 < decode->channel_count);
    }
    if (bVar20) {
      return 3;
    }
    piVar19 = piVar19 + (int)uVar4;
    uVar28 = uVar28 + 1;
    if (uVar28 == uVar9) {
      return 0;
    }
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack_deep_pointers (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    void**         pdata;
    int            w, h, bpc, ubpc, uls;

    w   = decode->chunk.width;
    h   = decode->chunk.height - decode->user_line_end_ignore;
    /* for user line skip, we use y in the loop so account for that */
    uls = decode->user_line_begin_skip;
    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;
            size_t                     pixstride;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            pdata = (void**) decc->decode_to_ptr;

            if (y < uls || !pdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];
                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);
                continue;
            }

            pdata += ((size_t) y - uls) *
                     (((size_t) decc->user_line_stride) / sizeof (void*));
            pixstride = ((size_t) decc->user_pixel_stride) / sizeof (void*);

            for (int x = 0; x < w; ++x)
            {
                void*   outpix = *pdata;
                int32_t samps  = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                pdata += pixstride;
                if (outpix)
                {
                    uint8_t* cdata = outpix;

                    UNPACK_SAMPLES (samps)
                }
                srcbuffer += ((size_t) bpc) * ((size_t) samps);
            }
        }
        sampbuffer += w;
    }
    return EXR_ERR_SUCCESS;
}